

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void Plink_copy(plink **to,plink *from)

{
  plink *ppVar1;
  
  if (from != (plink *)0x0) {
    do {
      ppVar1 = from->next;
      from->next = *to;
      *to = from;
      from = ppVar1;
    } while (ppVar1 != (plink *)0x0);
  }
  return;
}

Assistant:

void Plink_copy(struct plink **to, struct plink *from)
{
  struct plink *nextpl;
  while( from ){
    nextpl = from->next;
    from->next = *to;
    *to = from;
    from = nextpl;
  }
}